

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

VendorType parseVendor(StringRef VendorName)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  VendorType *pVVar4;
  size_t sVar5;
  int *__s1;
  bool bVar6;
  bool bVar7;
  Optional<llvm::Triple::VendorType> local_38;
  
  sVar5 = VendorName.Length;
  __s1 = (int *)VendorName.Data;
  local_38.Storage.hasVal = false;
  if (sVar5 == 5) {
    iVar3 = bcmp(__s1,"apple",5);
    bVar6 = true;
    if (iVar3 == 0) {
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x01';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
      bVar1 = true;
LAB_0012c3fa:
      local_38.Storage.hasVal = true;
      bVar6 = true;
      bVar2 = true;
    }
    else {
      bVar2 = false;
      bVar1 = true;
    }
LAB_0012c409:
    bVar7 = sVar5 != 3;
    if ((bVar7 || bVar2) || (iVar3 = bcmp(__s1,"bgp",3), iVar3 != 0)) goto LAB_0012c433;
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x04';
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
  }
  else {
    bVar1 = sVar5 != 2;
    if (sVar5 == 2) {
      if ((short)*__s1 == 0x6370) {
        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x02';
        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
        goto LAB_0012c3fa;
      }
      bVar2 = false;
      bVar6 = true;
      goto LAB_0012c409;
    }
    bVar6 = sVar5 != 4;
    if (bVar6) {
      bVar2 = false;
      goto LAB_0012c409;
    }
    if (*__s1 == 0x69656373) {
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
           (AlignedCharArray<4UL,_4UL>)(char  [4])0x3;
      local_38.Storage.hasVal = true;
      bVar7 = true;
      bVar2 = true;
    }
    else {
      bVar2 = false;
      bVar7 = true;
    }
LAB_0012c433:
    if ((bVar7 || bVar2) || (iVar3 = bcmp(__s1,"bgq",3), iVar3 != 0)) {
      if ((bVar7 || bVar2) || (iVar3 = bcmp(__s1,"fsl",3), iVar3 != 0)) {
        if ((bVar7 || bVar2) || (iVar3 = bcmp(__s1,"ibm",3), iVar3 != 0)) {
          if ((bVar7 || bVar2) || (iVar3 = bcmp(__s1,"img",3), iVar3 != 0)) {
            if ((bVar7 || bVar2) || (iVar3 = bcmp(__s1,"mti",3), iVar3 != 0)) {
              if ((sVar5 != 6 || bVar2) || (iVar3 = bcmp(__s1,"nvidia",6), iVar3 != 0)) {
                if ((bVar7 || bVar2) || (iVar3 = bcmp(__s1,"csr",3), iVar3 != 0)) {
                  if ((sVar5 != 6 || bVar2) || (iVar3 = bcmp(__s1,"myriad",6), iVar3 != 0)) {
                    if ((bVar7 || bVar2) || (iVar3 = bcmp(__s1,"amd",3), iVar3 != 0)) {
                      if ((bVar6 || bVar2) || (*__s1 != 0x6173656d)) {
                        if ((bVar6 || bVar2) || (*__s1 != 0x65737573)) {
                          if ((bVar1 || bVar2) || ((short)*__s1 != 0x656f)) {
                            if (!bVar2) {
                              return UnknownVendor;
                            }
                            goto LAB_0012c5d7;
                          }
                          local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] =
                               '\x10';
                          local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0'
                          ;
                          local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0'
                          ;
                          local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0'
                          ;
                        }
                        else {
                          local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] =
                               '\x0f';
                          local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0'
                          ;
                          local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0'
                          ;
                          local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0'
                          ;
                        }
                      }
                      else {
                        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x0e'
                        ;
                        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
                        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
                        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
                      }
                    }
                    else {
                      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\r';
                      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
                      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
                      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
                    }
                  }
                  else {
                    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\f';
                    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
                    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
                    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
                  }
                }
                else {
                  local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\v';
                  local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
                  local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
                  local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
                }
              }
              else {
                local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\n';
                local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
                local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
                local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
              }
            }
            else {
              local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\t';
              local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
              local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
              local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
            }
          }
          else {
            local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\b';
            local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
            local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
            local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
          }
        }
        else {
          local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\a';
          local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
          local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
          local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
        }
      }
      else {
        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x06';
        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
      }
    }
    else {
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[0] = '\x05';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[1] = '\0';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[2] = '\0';
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer[3] = '\0';
    }
  }
  local_38.Storage.hasVal = true;
LAB_0012c5d7:
  pVVar4 = llvm::Optional<llvm::Triple::VendorType>::getPointer(&local_38);
  return *pVVar4;
}

Assistant:

static Triple::VendorType parseVendor(StringRef VendorName) {
  return StringSwitch<Triple::VendorType>(VendorName)
    .Case("apple", Triple::Apple)
    .Case("pc", Triple::PC)
    .Case("scei", Triple::SCEI)
    .Case("bgp", Triple::BGP)
    .Case("bgq", Triple::BGQ)
    .Case("fsl", Triple::Freescale)
    .Case("ibm", Triple::IBM)
    .Case("img", Triple::ImaginationTechnologies)
    .Case("mti", Triple::MipsTechnologies)
    .Case("nvidia", Triple::NVIDIA)
    .Case("csr", Triple::CSR)
    .Case("myriad", Triple::Myriad)
    .Case("amd", Triple::AMD)
    .Case("mesa", Triple::Mesa)
    .Case("suse", Triple::SUSE)
    .Case("oe", Triple::OpenEmbedded)
    .Default(Triple::UnknownVendor);
}